

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::RowScope::addAssignment<std::__cxx11::string>
          (RowScope *this,string *name,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  int *val;
  int id;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  id = (int)((ulong)((long)(this->atoms).
                           super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->atoms).
                          super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + 100;
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  Transformer::toSQLiteValue_abi_cxx11_(&local_78,(Transformer *)&id,val);
  std::operator+(&local_58,"?",&local_78);
  addSimpleAssign(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  local_78._M_dataplus._M_p = (pointer)operator_new(0x10);
  *(undefined ***)local_78._M_dataplus._M_p = &PTR_bindValue_001bb420;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   (local_78._M_dataplus._M_p + 8) = atom->val;
  std::vector<hiberlite::abstract_atom*,std::allocator<hiberlite::abstract_atom*>>::
  emplace_back<hiberlite::abstract_atom*>
            ((vector<hiberlite::abstract_atom*,std::allocator<hiberlite::abstract_atom*>> *)this,
             (abstract_atom **)&local_78);
  return;
}

Assistant:

inline void RowScope::addAssignment(const std::string name, db_atom<C>& atom){
	int id=FirstAtom+static_cast<int>(atoms.size());

	addSimpleAssign(name, "?"+Transformer::toSQLiteValue(id) );

	db_atom<C>* x=new db_atom<C>(atom);
	atoms.push_back(x);
}